

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

int fits_quantize_float(long row,float *fdata,long nxpix,long nypix,int nullcheck,
                       float in_null_value,float qlevel,int dither_method,int *idata,double *bscale,
                       double *bzero,int *iminval,int *imaxval)

{
  undefined1 auVar1 [16];
  float fVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  uint uVar24;
  double dVar25;
  undefined4 in_XMM7_Dc;
  undefined4 in_XMM7_Dd;
  float minval;
  float maxval;
  float local_94;
  long ngood;
  undefined1 local_88 [16];
  double local_70;
  float local_68;
  double noise5;
  double noise3;
  double noise2;
  int status;
  
  ngood = 0;
  iVar7 = 0;
  minval = 0.0;
  maxval = 0.0;
  uVar18 = nypix * nxpix;
  if ((long)uVar18 < 2) {
    dVar19 = 0.0;
    dVar20 = 1.0;
LAB_001aeb41:
    *bscale = dVar20;
    *bzero = dVar19;
  }
  else {
    local_94 = in_null_value;
    if (0.0 <= qlevel) {
      local_88._0_4_ = dither_method;
      local_70 = (double)qlevel;
      local_68 = qlevel;
      FnNoise5_float(fdata,nxpix,nypix,nullcheck,in_null_value,&ngood,&minval,&maxval,&noise2,
                     &noise3,&noise5,&status);
      if ((nullcheck == 0) || (ngood != 0)) {
        if (noise3 <= noise2 || noise2 == 0.0) {
          noise2 = noise3;
        }
        if (((noise5 != 0.0) || (NAN(noise5))) && (noise5 < noise2)) {
          noise2 = noise5;
        }
      }
      else {
        minval = 0.0;
        maxval = 1.0;
        noise2 = 1.0;
      }
      in_XMM7_Dd = 0;
      dVar20 = noise2 / local_70;
      if ((local_68 == 0.0) && (!NAN(local_68))) {
        dVar20 = noise2 * 0.25;
      }
      in_XMM7_Dc = 0;
      dither_method = local_88._0_4_;
      if ((dVar20 != 0.0) || (NAN(dVar20))) goto LAB_001ae70a;
    }
    else {
      lVar9 = 1;
      lVar11 = nypix;
      if (nxpix < 5) {
        lVar11 = 1;
        lVar9 = nypix;
      }
      dVar20 = (double)-qlevel;
      lVar3 = lVar9 * nxpix;
      if (lVar3 < 5) {
        if (lVar3 < 1) {
          maxval = -3.4028235e+38;
          minval = 3.4028235e+38;
          ngood = 0;
        }
        else {
          minval = 3.4028235e+38;
          maxval = -3.4028235e+38;
          ngood = 0;
          lVar11 = 0;
          do {
            if (nullcheck == 0) {
LAB_001ae39e:
              fVar23 = fdata[lVar11];
              fVar2 = fVar23;
              if (minval <= fVar23) {
                fVar2 = minval;
              }
              if (fVar23 <= maxval) {
                fVar23 = maxval;
              }
              ngood = ngood + 1;
              maxval = fVar23;
              minval = fVar2;
            }
            else if ((fdata[lVar11] != in_null_value) || (NAN(fdata[lVar11]) || NAN(in_null_value)))
            goto LAB_001ae39e;
            lVar11 = lVar11 + 1;
          } while (lVar3 - lVar11 != 0);
        }
      }
      else if (lVar11 < 1) {
        maxval = -3.4028235e+38;
        minval = 3.4028235e+38;
        ngood = 0;
      }
      else {
        minval = 3.4028235e+38;
        maxval = -3.4028235e+38;
        ngood = 0;
        lVar12 = 0;
        pfVar8 = fdata;
        do {
          lVar15 = 0;
          lVar16 = lVar15;
          if (nullcheck != 0) {
            do {
              lVar16 = lVar15;
              if ((pfVar8[lVar15] != in_null_value) || (NAN(pfVar8[lVar15]) || NAN(in_null_value)))
              break;
              lVar15 = lVar15 + 1;
              lVar16 = lVar3;
            } while (lVar3 - lVar15 != 0);
          }
          if (lVar16 != lVar3) {
            lVar15 = lVar16 + 1;
            lVar13 = lVar15;
            if ((nullcheck != 0) && (lVar15 < lVar3)) {
              while (lVar13 = lVar15, pfVar8[lVar15] == in_null_value) {
                if ((NAN(pfVar8[lVar15]) || NAN(in_null_value)) ||
                   (lVar15 = lVar15 + 1, lVar13 = lVar3, lVar3 - lVar15 == 0)) break;
              }
            }
            lVar15 = lVar12 * lVar3;
            fVar23 = fdata[lVar15 + lVar16];
            fVar2 = fVar23;
            if (minval <= fVar23) {
              fVar2 = minval;
            }
            if (fVar23 <= maxval) {
              fVar23 = maxval;
            }
            minval = fVar2;
            maxval = fVar23;
            if (lVar13 != lVar3) {
              lVar16 = lVar13 + 1;
              lVar17 = lVar16;
              if ((nullcheck != 0) && (lVar16 < lVar3)) {
                while (lVar17 = lVar16, pfVar8[lVar16] == in_null_value) {
                  if ((NAN(pfVar8[lVar16]) || NAN(in_null_value)) ||
                     (lVar16 = lVar16 + 1, lVar17 = lVar3, lVar3 - lVar16 == 0)) break;
                }
              }
              maxval = fdata[lVar15 + lVar13];
              minval = maxval;
              if (fVar2 <= maxval) {
                minval = fVar2;
              }
              if (maxval <= fVar23) {
                maxval = fVar23;
              }
              if (lVar17 != lVar3) {
                lVar16 = lVar17 + 1;
                lVar13 = lVar16;
                if ((nullcheck != 0) && (lVar16 < lVar3)) {
                  while (lVar13 = lVar16, pfVar8[lVar16] == in_null_value) {
                    if ((NAN(pfVar8[lVar16]) || NAN(in_null_value)) ||
                       (lVar16 = lVar16 + 1, lVar13 = lVar3, lVar3 - lVar16 == 0)) break;
                  }
                }
                fVar23 = fdata[lVar15 + lVar17];
                fVar2 = fVar23;
                if (minval <= fVar23) {
                  fVar2 = minval;
                }
                if (fVar23 <= maxval) {
                  fVar23 = maxval;
                }
                minval = fVar2;
                maxval = fVar23;
                if (lVar13 != lVar3) {
                  maxval = fdata[lVar15 + lVar13];
                  minval = maxval;
                  if (fVar2 <= maxval) {
                    minval = fVar2;
                  }
                  if (maxval <= fVar23) {
                    maxval = fVar23;
                  }
                  while (lVar16 = lVar13 + 1, lVar16 < lVar3) {
                    lVar13 = lVar16;
                    if ((nullcheck != 0) && (lVar16 < lVar3)) {
                      while (lVar13 = lVar16, pfVar8[lVar16] == in_null_value) {
                        if ((NAN(pfVar8[lVar16]) || NAN(in_null_value)) ||
                           (lVar16 = lVar16 + 1, lVar13 = lVar3, lVar3 - lVar16 == 0)) break;
                      }
                    }
                    if (lVar13 == lVar3) break;
                    fVar23 = fdata[lVar15 + lVar13];
                    fVar2 = fVar23;
                    if (minval <= fVar23) {
                      fVar2 = minval;
                    }
                    if (fVar23 <= maxval) {
                      fVar23 = maxval;
                    }
                    ngood = ngood + 1;
                    maxval = fVar23;
                    minval = fVar2;
                  }
                  ngood = ngood + 4;
                }
              }
            }
          }
          lVar12 = lVar12 + 1;
          pfVar8 = pfVar8 + lVar9 * nxpix;
        } while (lVar12 != lVar11);
      }
LAB_001ae70a:
      if ((double)(maxval - minval) / dVar20 <= 4294967284.0) {
        if (row < 1) {
          uVar6 = 0;
          iVar7 = 0;
        }
        else {
          if (fits_rand_value == (float *)0x0) {
            local_88._8_4_ = in_XMM7_Dc;
            local_88._0_8_ = dVar20;
            local_88._12_4_ = in_XMM7_Dd;
            iVar7 = fits_init_randoms();
            dVar20 = (double)local_88._0_8_;
            if (iVar7 != 0) {
              return 0x71;
            }
          }
          uVar6 = (ulong)(uint)((int)(row - 1U) + (int)((row - 1U) / 10000) * -10000);
          iVar7 = (int)(fits_rand_value[uVar6] * 500.0);
        }
        pfVar8 = fits_rand_value;
        if (ngood == uVar18) {
          if (dither_method == 2) {
            dVar19 = dVar20 * 2147483637.0 + (double)minval;
          }
          else if (2147483637.0 <= (double)(maxval - minval) / dVar20) {
            dVar19 = (double)(maxval + minval) * 0.5;
          }
          else {
            dVar19 = (double)(long)((double)minval / dVar20 + 0.5) * dVar20;
          }
          if (row < 1) {
            uVar6 = 1;
            if (1 < (long)uVar18) {
              uVar6 = uVar18;
            }
            uVar18 = 0;
            do {
              dVar25 = ((double)fdata[uVar18] - dVar19) / dVar20;
              idata[uVar18] = (int)(dVar25 + *(double *)(&DAT_001d7130 + (ulong)(dVar25 < 0.0) * 8))
              ;
              uVar18 = uVar18 + 1;
            } while (uVar6 != uVar18);
          }
          else {
            uVar10 = 1;
            if (1 < (long)uVar18) {
              uVar10 = uVar18;
            }
            uVar18 = 0;
            do {
              if (dither_method == 2) {
                iVar14 = -0x7ffffffe;
                if ((fdata[uVar18] != 0.0) || (NAN(fdata[uVar18]))) goto LAB_001ae9f9;
              }
              else {
LAB_001ae9f9:
                dVar25 = (double)pfVar8[iVar7] + ((double)fdata[uVar18] - dVar19) / dVar20 + -0.5;
                iVar14 = (int)(dVar25 + *(double *)(&DAT_001d7130 + (ulong)(dVar25 < 0.0) * 8));
              }
              idata[uVar18] = iVar14;
              iVar7 = iVar7 + 1;
              if (iVar7 == 10000) {
                uVar4 = (int)uVar6 + 1;
                uVar6 = (ulong)uVar4;
                if (uVar4 == 10000) {
                  uVar6 = 0;
                }
                iVar7 = (int)(pfVar8[(int)uVar6] * 500.0);
              }
              uVar18 = uVar18 + 1;
            } while (uVar10 != uVar18);
          }
        }
        else {
          dVar19 = dVar20 * 2147483637.0 + (double)minval;
          if (row < 1) {
            uVar6 = 1;
            if (1 < (long)uVar18) {
              uVar6 = uVar18;
            }
            uVar18 = 0;
            do {
              fVar23 = fdata[uVar18];
              if ((fVar23 != local_94) || (NAN(fVar23) || NAN(local_94))) {
                dVar25 = ((double)fVar23 - dVar19) / dVar20;
                iVar7 = (int)(dVar25 + *(double *)(&DAT_001d7130 + (ulong)(dVar25 < 0.0) * 8));
              }
              else {
                iVar7 = -0x7fffffff;
              }
              idata[uVar18] = iVar7;
              uVar18 = uVar18 + 1;
            } while (uVar6 != uVar18);
          }
          else {
            uVar10 = 1;
            if (1 < (long)uVar18) {
              uVar10 = uVar18;
            }
            uVar18 = 0;
            do {
              fVar23 = fdata[uVar18];
              if ((fVar23 != local_94) || (NAN(fVar23) || NAN(local_94))) {
                if (dither_method == 2) {
                  iVar14 = -0x7ffffffe;
                  if ((fVar23 == 0.0) && (!NAN(fVar23))) goto LAB_001ae872;
                }
                dVar25 = (double)pfVar8[iVar7] + ((double)fVar23 - dVar19) / dVar20 + -0.5;
                iVar14 = (int)(dVar25 + *(double *)(&DAT_001d7130 + (ulong)(dVar25 < 0.0) * 8));
              }
              else {
                iVar14 = -0x7fffffff;
              }
LAB_001ae872:
              idata[uVar18] = iVar14;
              iVar7 = iVar7 + 1;
              if (iVar7 == 10000) {
                uVar4 = (int)uVar6 + 1;
                uVar6 = (ulong)uVar4;
                if (uVar4 == 10000) {
                  uVar6 = 0;
                }
                iVar7 = (int)(pfVar8[(int)uVar6] * 500.0);
              }
              uVar18 = uVar18 + 1;
            } while (uVar10 != uVar18);
          }
        }
        auVar21._0_8_ = (double)maxval - dVar19;
        auVar21._8_8_ = (double)minval - dVar19;
        auVar22._8_4_ = SUB84(dVar20,0);
        auVar22._0_8_ = dVar20;
        auVar22._12_4_ = (int)((ulong)dVar20 >> 0x20);
        auVar22 = divpd(auVar21,auVar22);
        lVar11 = -(ulong)(auVar22._8_8_ < 0.0);
        auVar1._8_4_ = (int)lVar11;
        auVar1._0_8_ = -(ulong)(auVar22._0_8_ < 0.0);
        auVar1._12_4_ = (int)((ulong)lVar11 >> 0x20);
        uVar5 = movmskpd((int)uVar6,auVar1);
        uVar24 = 0xbfe00000;
        uVar4 = uVar24;
        if ((uVar5 & 2) == 0) {
          uVar4 = 0x3fe00000;
        }
        *iminval = (int)(auVar22._8_8_ + (double)((ulong)uVar4 << 0x20));
        if ((uVar5 & 1) == 0) {
          uVar24 = 0x3fe00000;
        }
        *imaxval = (int)(auVar22._0_8_ + (double)((ulong)uVar24 << 0x20));
        iVar7 = 1;
        goto LAB_001aeb41;
      }
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int fits_quantize_float (long row, float fdata[], long nxpix, long nypix, int nullcheck, 
	float in_null_value, float qlevel, int dither_method, int idata[], double *bscale,
	double *bzero, int *iminval, int *imaxval) {

/* arguments:
long row            i: if positive, used to calculate random dithering seed value
                       (this is only used when dithering the quantized values)
float fdata[]       i: array of image pixels to be compressed
long nxpix          i: number of pixels in each row of fdata
long nypix          i: number of rows in fdata
nullcheck           i: check for nullvalues in fdata?
float in_null_value i: value used to represent undefined pixels in fdata
float qlevel        i: quantization level
int dither_method   i; which dithering method to use
int idata[]         o: values of fdata after applying bzero and bscale
double bscale       o: scale factor
double bzero        o: zero offset
int iminval         o: minimum quantized value that is returned
int imaxval         o: maximum quantized value that is returned

The function value will be one if the input fdata were copied to idata;
in this case the parameters bscale and bzero can be used to convert back to
nearly the original floating point values:  fdata ~= idata * bscale + bzero.
If the function value is zero, the data were not copied to idata.
*/

	int status, iseed = 0;
	long i, nx, ngood = 0;
	double stdev, noise2, noise3, noise5;	/* MAD 2nd, 3rd, and 5th order noise values */
	float minval = 0., maxval = 0.;  /* min & max of fdata */
	double delta;		/* bscale, 1 in idata = delta in fdata */
	double zeropt;	        /* bzero */
	double temp;
        int nextrand = 0;
	extern float *fits_rand_value; /* this is defined in imcompress.c */
	LONGLONG iqfactor;

	nx = nxpix * nypix;
	if (nx <= 1) {
	    *bscale = 1.;
	    *bzero  = 0.;
	    return (0);
	}

        if (qlevel >= 0.) {

	    /* estimate background noise using MAD pixel differences */
	    FnNoise5_float(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, &noise2, &noise3, &noise5, &status);      

	    if (nullcheck && ngood == 0) {   /* special case of an image filled with Nulls */
	        /* set parameters to dummy values, which are not used */
		minval = 0.;
		maxval = 1.;
		stdev = 1;
	    } else {

	        /* use the minimum of noise2, noise3, and noise5 as the best noise value */
	        stdev = noise3;
	        if (noise2 != 0. && noise2 < stdev) stdev = noise2;
	        if (noise5 != 0. && noise5 < stdev) stdev = noise5;
            }

	    if (qlevel == 0.)
	        delta = stdev / 4.;  /* default quantization */
	    else
	        delta = stdev / qlevel;

	    if (delta == 0.) 
	        return (0);			/* don't quantize */

	} else {
	    /* negative value represents the absolute quantization level */
	    delta = -qlevel;

	    /* only nned to calculate the min and max values */
	    FnNoise3_float(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, 0, &status);      
 	}

        /* check that the range of quantized levels is not > range of int */
	if ((maxval - minval) / delta > 2. * 2147483647. - N_RESERVED_VALUES )
	    return (0);			/* don't quantize */

        if (row > 0) { /* we need to dither the quantized values */
            if (!fits_rand_value) 
	        if (fits_init_randoms()) return(MEMORY_ALLOCATION);

	    /* initialize the index to the next random number in the list */
            iseed = (int) ((row - 1) % N_RANDOM);
	    nextrand = (int) (fits_rand_value[iseed] * 500.);
	}

        if (ngood == nx) {   /* don't have to check for nulls */
            /* return all positive values, if possible since some */
            /* compression algorithms either only work for positive integers, */
            /* or are more efficient.  */

            if (dither_method == SUBTRACTIVE_DITHER_2)
	    {
                /* shift the range to be close to the value used to represent zeros */
                zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);
            }
	    else if ((maxval - minval) / delta < 2147483647. - N_RESERVED_VALUES )
            {
                zeropt = minval;
		/* fudge the zero point so it is an integer multiple of delta */
		/* This helps to ensure the same scaling will be performed if the */
		/* file undergoes multiple fpack/funpack cycles */
		iqfactor = (LONGLONG) (zeropt/delta  + 0.5);
		zeropt = iqfactor * delta;               
            }
            else
            {
                /* center the quantized levels around zero */
                zeropt = (minval + maxval) / 2.;
            }

            if (row > 0) {  /* dither the values when quantizing */
              for (i = 0;  i < nx;  i++) {
	    
		if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		   idata[i] = ZERO_VALUE;
		} else {
		   idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		}

                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */

       	        for (i = 0;  i < nx;  i++) {
	            idata[i] = NINT ((fdata[i] - zeropt) / delta);
                }
            } 
        }
        else {
            /* data contains null values; shift the range to be */
            /* close to the value used to represent null values */
            zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);

            if (row > 0) {  /* dither the values */
	      for (i = 0;  i < nx;  i++) {
                if (fdata[i] != in_null_value) {
		    if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		       idata[i] = ZERO_VALUE;
		    } else {
		       idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		    }
                } else {
                    idata[i] = NULL_VALUE;
                }

                /* increment the random number index, regardless */
                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */
	       for (i = 0;  i < nx;  i++) {
 
                 if (fdata[i] != in_null_value) {
		    idata[i] =  NINT((fdata[i] - zeropt) / delta);
                 } else { 
                    idata[i] = NULL_VALUE;
                 }
               }
            }
	}

        /* calc min and max values */
        temp = (minval - zeropt) / delta;
        *iminval =  NINT (temp);
        temp = (maxval - zeropt) / delta;
        *imaxval =  NINT (temp);

	*bscale = delta;
	*bzero = zeropt;
	return (1);			/* yes, data have been quantized */
}